

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Ray *_ray,Triangle *_triangle)

{
  bool bVar1;
  vec3 vVar2;
  IntersectionData *idata;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_38;
  float local_24;
  float local_20;
  float v;
  float u;
  float t;
  Triangle *_triangle_local;
  Ray *_ray_local;
  
  _u = _triangle;
  _triangle_local = (Triangle *)_ray;
  IntersectionData::IntersectionData(__return_storage_ptr__);
  bVar1 = intersection((Ray *)_triangle_local,_u,&v,&local_20,&local_24);
  __return_storage_ptr__->hit = bVar1;
  if ((__return_storage_ptr__->hit & 1U) != 0) {
    __return_storage_ptr__->distance = v;
    vVar2 = Ray::getAt((Ray *)_triangle_local,v);
    idata = vVar2._0_8_;
    local_38 = vVar2.field_2;
    *(IntersectionData **)&__return_storage_ptr__->position = idata;
    (__return_storage_ptr__->position).field_2 = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Ray& _ray, const Triangle& _triangle) {

    IntersectionData idata;

    float t,u,v;
    idata.hit = intersection(_ray, _triangle, t, u, v);
    // idata.hit = intersectionMT(_ray, _triangle, t, u, v);

    if (!idata.hit) return idata;

    // float vn = glm::dot(_ray.getDirection(), _triangle.getNormal());
    // glm::vec3 aa = _ray.getOrigin() - _triangle[0];
    // float xpn = glm::dot(aa, _triangle.getNormal());
    // idata.distance = -xpn / vn;
    idata.distance = t;
    idata.position = _ray.getAt(t);
    return idata;

}